

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<VkQueue_T_*> * __thiscall
vkb::Device::get_dedicated_queue
          (Result<VkQueue_T_*> *__return_storage_ptr__,Device *this,QueueType type)

{
  Result<unsigned_int> index;
  anon_union_24_2_293c120a_for_Result<unsigned_int>_1 local_38;
  char local_20;
  
  get_dedicated_queue_index((Result<unsigned_int> *)&local_38.m_error,this,type);
  if (local_20 == '\0') {
    (__return_storage_ptr__->field_0).m_error.type._M_value = local_38.m_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = local_38.m_error.type._M_cat;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  }
  else {
    (*(this->internal_table).fp_vkGetDeviceQueue)
              (this->device,local_38.m_value,0,(VkQueue *)__return_storage_ptr__);
  }
  __return_storage_ptr__->m_init = local_20 != '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<VkQueue> Device::get_dedicated_queue(QueueType type) const {
    auto index = get_dedicated_queue_index(type);
    if (!index.has_value()) return { index.error() };
    VkQueue out_queue;
    internal_table.fp_vkGetDeviceQueue(device, index.value(), 0, &out_queue);
    return out_queue;
}